

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O2

bool glcts::verifyImage<float,1u,3u,3u>(float *data,float *expected_values,GLuint n_layers)

{
  GLuint GVar1;
  bool bVar2;
  GLuint cube_face;
  
  GVar1 = 0;
  do {
    cube_face = GVar1;
    if (n_layers * 6 == cube_face) break;
    bVar2 = verifyFace<float,1u,3u,3u>(data,cube_face,expected_values,n_layers * 0x12);
    GVar1 = cube_face + 1;
  } while (bVar2);
  return n_layers * 6 <= cube_face;
}

Assistant:

bool verifyImage(const T* data, const T* expected_values, const glw::GLuint n_layers)
{
	static const glw::GLuint n_faces = 6;

	const glw::GLuint n_total_faces = n_layers * n_faces;

	for (glw::GLuint face = 0; face < n_total_faces; ++face)
	{
		if (false == verifyFace<T, N_Components, Width, Height>(data, face, expected_values, n_total_faces * Width))
		{
			return false;
		}
	}

	return true;
}